

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O1

void jsoncons::jsonpointer::
     add<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
               basic_json_pointer<char> *location,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *value,
               bool create_if_missing,error_code *ec)

{
  pointer pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  size_t sVar5;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *pkVar6;
  undefined7 in_register_00000009;
  error_code *n;
  jsonpointer_errc __e;
  pointer pbVar7;
  type tVar8;
  array_range_type aVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  size_t index;
  detail *local_78;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_70;
  detail local_68 [16];
  undefined1 local_58 [24];
  string_view_type local_40;
  
  n = (error_code *)CONCAT71(in_register_00000009,create_if_missing);
  local_78 = local_68;
  local_70 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)0x0;
  local_68[0] = (detail)0x0;
  pbVar7 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != pbVar1) {
    do {
      std::__cxx11::string::_M_assign((string *)&local_78);
      pbVar7 = pbVar7 + 1;
      if (pbVar7 != pbVar1) {
        local_58._0_8_ = local_70;
        local_58._8_8_ = local_78;
        n = ec;
        root = detail::
               resolve<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                         (root,(string_view_type *)local_58,create_if_missing,ec);
        if (ec->_M_value != 0) goto LAB_003adcd5;
      }
    } while (pbVar7 != pbVar1);
  }
  bVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(root);
  if (bVar4) {
    if ((local_70 ==
         (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *)0x1) && (*local_78 == (detail)0x2d)) {
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)root,value);
      sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(root);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(root,sVar5 - 1);
      goto LAB_003adcd5;
    }
    local_58._0_8_ =
         (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *)0x0;
    tVar8 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                      (local_78,(char *)local_70,(size_t)local_58,(unsigned_long *)n);
    uVar2 = local_58._0_8_;
    __e = invalid_index;
    if (tVar8.ec == success) {
      pkVar6 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(root);
      uVar3 = local_58._0_8_;
      __e = index_exceeds_array_size;
      if ((ulong)uVar2 <= pkVar6) {
        pkVar6 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(root);
        if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)uVar3 == pkVar6) {
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                    ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)root,value);
          sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(root);
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(root,sVar5 - 1);
        }
        else {
          aVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                            (root);
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          insert<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                    ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)root,
                     aVar9.first_._M_current._M_current + local_58._0_8_,value);
        }
        goto LAB_003adcd5;
      }
    }
  }
  else {
    bVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(root);
    if (bVar4) {
      local_40._M_len = (size_t)local_70;
      local_40._M_str = (char *)local_78;
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      insert_or_assign<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                  *)local_58,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)root,
                 &local_40,value);
      goto LAB_003adcd5;
    }
    __e = expected_object_or_array;
  }
  std::error_code::operator=(ec,__e);
LAB_003adcd5:
  add<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
            ();
  return;
}

Assistant:

void add(Json& root, 
             const basic_json_pointer<typename Json::char_type>& location, 
             T&& value, 
             bool create_if_missing,
             std::error_code& ec)
    {
        Json* current = std::addressof(root);

        std::basic_string<typename Json::char_type> buffer;
        auto it = location.begin();
        auto end = location.end();
        while (it != end)
        {
            buffer = *it;
            ++it;
            if (it != end)
            {
                current = jsoncons::jsonpointer::detail::resolve(current, buffer, create_if_missing, ec);
                if (JSONCONS_UNLIKELY(ec))
                    return;
            }
        }
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                current->emplace_back(std::forward<T>(value));
                current = std::addressof(current->at(current->size()-1));
            }
            else
            {
                std::size_t index{0};
                auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
                if (!result)
                {
                    ec = jsonpointer_errc::invalid_index;
                    return;
                }
                if (index > current->size())
                {
                    ec = jsonpointer_errc::index_exceeds_array_size;
                    return;
                }
                if (index == current->size())
                {
                    current->emplace_back(std::forward<T>(value));
                    current = std::addressof(current->at(current->size()-1));
                }
                else
                {
                    auto it2 = current->insert(current->array_range().begin()+index,std::forward<T>(value));
                    current = std::addressof(*it2);
                }
            }
        }
        else if (current->is_object())
        {
            auto r = current->insert_or_assign(buffer,std::forward<T>(value));
            current = std::addressof(r.first->value());
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return;
        }
    }